

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImVec2 *p;
  double *pdVar1;
  double dVar2;
  short sVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  ImGuiWindow **ppIVar10;
  ImGuiWindow *potential_parent;
  undefined1 uVar11;
  uint uVar12;
  byte bVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  ImGuiWindow *pIVar22;
  ImGuiWindow *pIVar23;
  float fVar24;
  float fVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  ImGuiWindow *local_88;
  ImRect local_78;
  ImVec2 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar8 = GImGui;
  pIVar23 = GImGui->MovingWindow;
  pIVar22 = (ImGuiWindow *)0x0;
  if ((pIVar23 != (ImGuiWindow *)0x0) && ((pIVar23->Flags & 0x200) == 0)) {
    pIVar22 = pIVar23;
  }
  local_68 = (GImGui->Style).TouchExtraPadding;
  local_58._8_8_ = 0;
  local_58._0_4_ = local_68.x;
  local_58._4_4_ = local_68.y;
  if ((GImGui->IO).ConfigWindowsResizeFromEdges == true) {
    auVar25 = maxps(local_58,_DAT_001b0220);
    local_68 = auVar25._0_8_;
  }
  uStack_60 = 0;
  this = &GImGui->Windows;
  p = &(GImGui->IO).MousePos;
  local_88 = (ImGuiWindow *)0x0;
  iVar15 = (GImGui->Windows).Size;
LAB_00118e4a:
  do {
    iVar14 = iVar15;
    if (iVar14 < 1) {
      pIVar8->HoveredWindow = pIVar22;
      if (pIVar22 == (ImGuiWindow *)0x0) {
        pIVar22 = (ImGuiWindow *)0x0;
        pIVar23 = (ImGuiWindow *)0x0;
      }
      else {
LAB_00118fba:
        pIVar23 = pIVar22->RootWindow;
      }
      pIVar8->HoveredRootWindow = pIVar23;
      pIVar8->HoveredWindowUnderMovingWindow = local_88;
      potential_parent = GetTopMostPopupModal();
      bVar9 = false;
      if ((potential_parent != (ImGuiWindow *)0x0) && (bVar9 = false, pIVar23 != (ImGuiWindow *)0x0)
         ) {
        bVar9 = IsWindowChildOf(pIVar23,potential_parent);
        bVar9 = !bVar9;
      }
      uVar12 = (pIVar8->IO).ConfigFlags;
      uVar16 = 0xffffffffffffffff;
      uVar18 = 0;
      bVar13 = 0;
      while( true ) {
        iVar15 = (int)uVar16;
        if (uVar18 == 5) break;
        if ((pIVar8->IO).MouseClicked[uVar18] == true) {
          bVar19 = true;
          if (pIVar22 == (ImGuiWindow *)0x0) {
            bVar19 = 0 < (pIVar8->OpenPopupStack).Size;
          }
          (pIVar8->IO).MouseDownOwned[uVar18] = bVar19;
        }
        bVar19 = (pIVar8->IO).MouseDown[uVar18];
        if ((bVar19 == true) &&
           ((iVar15 == -1 ||
            (dVar2 = (pIVar8->IO).MouseClickedTime[iVar15],
            pdVar1 = (pIVar8->IO).MouseClickedTime + uVar18, *pdVar1 <= dVar2 && dVar2 != *pdVar1)))
           ) {
          uVar16 = uVar18 & 0xffffffff;
        }
        bVar13 = bVar13 & 1 | bVar19;
        uVar18 = uVar18 + 1;
      }
      bVar21 = 1;
      bVar17 = 1;
      if (iVar15 != -1) {
        bVar17 = (pIVar8->IO).MouseDownOwned[iVar15];
      }
      bVar20 = (byte)((uVar12 & 0x10) >> 4) | bVar9;
      if (pIVar8->DragDropActive == true) {
        bVar21 = (pIVar8->DragDropSourceFlags & 0x10U) == 0 | bVar20;
      }
      if (bVar17 != 0) {
        bVar21 = bVar20;
      }
      if (bVar21 != 0) {
        pIVar8->HoveredWindow = (ImGuiWindow *)0x0;
        pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
        pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
        pIVar22 = (ImGuiWindow *)0x0;
      }
      if (pIVar8->WantCaptureMouseNextFrame == -1) {
        bVar9 = true;
        if ((bVar17 & (pIVar22 != (ImGuiWindow *)0x0 | bVar13)) == 0) {
          bVar9 = 0 < (pIVar8->OpenPopupStack).Size;
        }
        (pIVar8->IO).WantCaptureMouse = bVar9;
      }
      else {
        (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
      }
      if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
        bVar9 = pIVar8->ActiveId != 0 || potential_parent != (ImGuiWindow *)0x0;
      }
      else {
        bVar9 = pIVar8->WantCaptureKeyboardNextFrame != 0;
      }
      uVar12 = uVar12 & 9;
      uVar11 = (char)uVar12;
      if (uVar12 != 1) {
        uVar11 = bVar9;
      }
      if ((pIVar8->IO).NavActive == false) {
        uVar11 = bVar9;
      }
      (pIVar8->IO).WantCaptureKeyboard = (bool)uVar11;
      (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
      return;
    }
    iVar15 = iVar14 + -1;
    ppIVar10 = ImVector<ImGuiWindow_*>::operator[](this,iVar15);
    pIVar23 = *ppIVar10;
  } while (((pIVar23->Active != true) || (pIVar23->Hidden != false)) ||
          ((pIVar23->Flags & 0x200) != 0));
  IVar6 = (pIVar23->OuterRectClipped).Min;
  IVar7 = (pIVar23->OuterRectClipped).Max;
  uVar12 = (uint)((pIVar23->Flags & 0x1000042U) == 0);
  auVar26._0_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
  auVar26._4_4_ = (int)(uVar12 << 0x1f) >> 0x1f;
  auVar26._8_8_ = 0;
  auVar25._8_8_ = uStack_60;
  auVar25._0_4_ = local_68.x;
  auVar25._4_4_ = local_68.y;
  auVar27 = ~auVar26 & local_58 | auVar25 & auVar26;
  fVar24 = auVar27._0_4_;
  fVar28 = auVar27._4_4_;
  auVar4._4_8_ = SUB168(auVar25 & auVar26,8);
  auVar4._0_4_ = fVar28;
  auVar27._0_8_ = auVar4._0_8_ << 0x20;
  auVar27._8_4_ = fVar24;
  auVar27._12_4_ = fVar28;
  local_78.Min.x = IVar6.x;
  local_78.Min.y = IVar6.y;
  local_78.Max.x = IVar7.x;
  local_78.Max.y = IVar7.y;
  auVar5._4_8_ = auVar27._8_8_;
  auVar5._0_4_ = fVar28 + local_78.Min.y;
  auVar29._0_8_ = auVar5._0_8_ << 0x20;
  auVar29._8_4_ = fVar24 + local_78.Max.x;
  auVar29._12_4_ = fVar28 + local_78.Max.y;
  local_78.Max = auVar29._8_8_;
  local_78.Min.y = local_78.Min.y - fVar28;
  local_78.Min.x = local_78.Min.x - fVar24;
  bVar9 = ImRect::Contains(&local_78,p);
  if (bVar9) {
    sVar3 = (pIVar23->HitTestHoleSize).x;
    if (sVar3 != 0) {
      auVar25 = pshuflw(ZEXT416((uint)pIVar23->HitTestHoleOffset),
                        ZEXT416((uint)pIVar23->HitTestHoleOffset),0x60);
      local_40.Min.x = (float)(auVar25._0_4_ >> 0x10) + (pIVar23->Pos).x;
      local_40.Min.y = (float)(auVar25._4_4_ >> 0x10) + (pIVar23->Pos).y;
      local_40.Max.x = (float)(int)sVar3 + local_40.Min.x;
      local_40.Max.y =
           (float)(int)((long)((ulong)(ushort)(pIVar23->HitTestHoleSize).y << 0x30) >> 0x30) +
           local_40.Min.y;
      bVar9 = ImRect::Contains(&local_40,p);
      if (bVar9) goto LAB_00118e4a;
    }
    if (pIVar22 == (ImGuiWindow *)0x0) {
      pIVar22 = pIVar23;
    }
    if (((local_88 == (ImGuiWindow *)0x0) &&
        (local_88 = pIVar23, pIVar8->MovingWindow != (ImGuiWindow *)0x0)) &&
       (pIVar23->RootWindow == pIVar8->MovingWindow->RootWindow)) {
      local_88 = (ImGuiWindow *)0x0;
    }
    else {
      if (pIVar22 != (ImGuiWindow *)0x0) {
        pIVar8->HoveredWindow = pIVar22;
        goto LAB_00118fba;
      }
      pIVar22 = (ImGuiWindow *)0x0;
    }
  }
  iVar15 = iVar14 + -1;
  goto LAB_00118e4a;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    bool clear_hovered_windows = false;
    FindHoveredWindow();

    // Modal windows prevents mouse from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window && g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
        clear_hovered_windows = true;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        clear_hovered_windows = true;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (g.OpenPopupStack.Size > 0);
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        clear_hovered_windows = true;

    if (clear_hovered_windows)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (g.OpenPopupStack.Size > 0);

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}